

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeListImpl.cpp
# Opt level: O2

XMLSize_t __thiscall xercesc_4_0::DOMNodeListImpl::getLength(DOMNodeListImpl *this)

{
  DOMNode **ppDVar1;
  DOMChildNode *pDVar2;
  XMLSize_t XVar3;
  
  if (this->fNode == (DOMParentNode *)0x0) {
    XVar3 = 0;
  }
  else {
    XVar3 = 0;
    ppDVar1 = &this->fNode->fFirstChild;
    while (*ppDVar1 != (DOMNode *)0x0) {
      XVar3 = XVar3 + 1;
      pDVar2 = castToChildImpl(*ppDVar1);
      ppDVar1 = &pDVar2->nextSibling;
    }
  }
  return XVar3;
}

Assistant:

XMLSize_t DOMNodeListImpl::getLength() const{
    XMLSize_t count = 0;
    if (fNode) {
        DOMNode *node = fNode->fFirstChild;
        while(node != 0){
            ++count;
            node = castToChildImpl(node)->nextSibling;
        }
    }

    return count;
}